

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O2

bool __thiscall libDAI::JTree::initProps(JTree *this)

{
  Properties *this_00;
  bool bVar1;
  UpdateType UVar2;
  unsigned_long uVar3;
  allocator<char> local_39;
  PropertyKey local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"updates",&local_39);
  this_00 = &(this->super_DAIAlgRG).super_InferenceAlgorithm._properties;
  bVar1 = Properties::hasKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"verbose",&local_39);
    bVar1 = Properties::hasKey(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"updates",&local_39);
      UVar2 = Properties::FromStringTo<libDAI::JTree::UpdateType>(this_00,&local_38);
      (this->Props).updates.v = UVar2.v;
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"verbose",&local_39);
      uVar3 = Properties::FromStringTo<unsigned_long>(this_00,&local_38);
      (this->Props).verbose = uVar3;
      std::__cxx11::string::~string((string *)&local_38);
      return true;
    }
  }
  return false;
}

Assistant:

bool JTree::initProps() {
        if( !HasProperty("updates") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        
        Props.updates = FromStringTo<UpdateType>("updates");
        Props.verbose = FromStringTo<size_t>("verbose");

        return true;
    }